

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.h
# Opt level: O1

void __thiscall absl::base_internal::SpinLockHolder::~SpinLockHolder(SpinLockHolder *this)

{
  uint lock_value;
  SpinLock *this_00;
  
  this_00 = this->lock_;
  LOCK();
  lock_value = (this_00->lockword_).super___atomic_base<unsigned_int>._M_i;
  (this_00->lockword_).super___atomic_base<unsigned_int>._M_i =
       (this_00->lockword_).super___atomic_base<unsigned_int>._M_i & 2;
  UNLOCK();
  if (7 < lock_value) {
    SpinLock::SlowUnlock(this_00,lock_value);
  }
  return;
}

Assistant:

inline ~SpinLockHolder() ABSL_UNLOCK_FUNCTION() { lock_->Unlock(); }